

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Statements * __thiscall Parser::fileInput(Parser *this)

{
  bool bVar1;
  Statements *this_00;
  bool *pbVar2;
  Token local_1f0;
  Token local_180;
  Statement *local_110;
  Statement *statement;
  undefined1 local_98 [8];
  Token tok;
  Statements *stmts;
  Parser *this_local;
  
  this_00 = (Statements *)operator_new(0x20);
  Statements::Statements(this_00);
  Tokenizer::getToken((Token *)local_98,this->tokenizer);
  while (pbVar2 = Token::eof((Token *)local_98), ((*pbVar2 ^ 0xffU) & 1) != 0) {
    while (pbVar2 = Token::eol((Token *)local_98), (*pbVar2 & 1U) != 0) {
      Tokenizer::getToken((Token *)&statement,this->tokenizer);
      Token::operator=((Token *)local_98,(Token *)&statement);
      Token::~Token((Token *)&statement);
    }
    Tokenizer::ungetToken(this->tokenizer);
    local_110 = stmt(this);
    bVar1 = Token::isDef((Token *)local_98);
    if (bVar1) {
      local_110->isFunction = true;
    }
    Statements::addStatement(this_00,local_110);
    Tokenizer::getToken(&local_180,this->tokenizer);
    Token::operator=((Token *)local_98,&local_180);
    Token::~Token(&local_180);
    while (pbVar2 = Token::eol((Token *)local_98), (*pbVar2 & 1U) != 0) {
      Tokenizer::getToken(&local_1f0,this->tokenizer);
      Token::operator=((Token *)local_98,&local_1f0);
      Token::~Token(&local_1f0);
    }
  }
  Tokenizer::ungetToken(this->tokenizer);
  Token::~Token((Token *)local_98);
  return this_00;
}

Assistant:

Statements *Parser::fileInput() {
    // file_input: {NEWLINE | stmt}* ENDMARKER
    auto *stmts = new Statements();
//    auto *funcs = new Functions();
    Token tok = tokenizer.getToken();
    while(!tok.eof()) {
        while(tok.eol())
            tok = tokenizer.getToken();
        tokenizer.ungetToken();
        Statement *statement = stmt();
        if(tok.isDef()) {
            statement->isFunction = true;
            //_functions->addFunction(dynamic_cast<Function *>(statement));
        }
        stmts->addStatement(statement);

        tok = tokenizer.getToken();
        while (tok.eol())
            tok = tokenizer.getToken();
//        if(tok.isDedent()){
//            tokenizer.ungetToken();
//            return stmts;
//        }
//
//        if(tok.eol()){
//        //    return stmts;
//        }
        //tok = tokenizer.getToken();
        //if(tok.isDedent()) break;


    }
    tokenizer.ungetToken();
    return stmts;
}